

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall
re2::DFA::RunWorkqOnByte(DFA *this,Workq *oldq,Workq *newq,int c,uint32_t flag,bool *ismatch)

{
  bool bVar1;
  InstOp IVar2;
  DFA *pDVar3;
  DFA *pDVar4;
  Inst *this_00;
  ostream *poVar5;
  int in_ECX;
  Prog *in_RDX;
  Workq *in_RSI;
  char *in_RDI;
  byte *in_R9;
  Inst *ip;
  int id;
  iterator i;
  int in_stack_fffffffffffffdec;
  Prog *in_stack_fffffffffffffdf0;
  InstOp in_stack_fffffffffffffdfc;
  LogMessage *in_stack_fffffffffffffe00;
  int line;
  LogMessage *in_stack_fffffffffffffe30;
  LogMessage local_1c0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  DFA *this_01;
  
  Workq::clear((Workq *)in_stack_fffffffffffffdf0);
  pDVar3 = (DFA *)SparseSetT<void>::begin((SparseSetT<void> *)0x24299d);
  do {
    this_01 = pDVar3;
    pDVar4 = (DFA *)SparseSetT<void>::end((SparseSetT<void> *)in_stack_fffffffffffffdf0);
    if (pDVar3 == pDVar4) {
      return;
    }
    bVar1 = Workq::is_mark(in_RSI,*(int *)&this_01->prog_);
    line = (int)((ulong)pDVar3 >> 0x20);
    if (bVar1) {
      if ((*in_R9 & 1) != 0) {
        return;
      }
      Workq::mark((Workq *)in_stack_fffffffffffffdf0);
    }
    else {
      iVar6 = *(int *)&this_01->prog_;
      this_00 = Prog::inst(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
      IVar2 = Prog::Inst::opcode(this_00);
      if (IVar2 != kInstAltMatch) {
        if (IVar2 == kInstByteRange) {
          bVar1 = Prog::Inst::Matches((Inst *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          if (bVar1) {
            in_stack_fffffffffffffdf0 = in_RDX;
            Prog::Inst::out(this_00);
            AddToQueue(this_01,(Workq *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                       (int)((ulong)this_00 >> 0x20),(uint32_t)this_00);
          }
        }
        else if (1 < IVar2 - kInstCapture) {
          if (IVar2 == kInstMatch) {
            bVar1 = Prog::anchor_end(*(Prog **)in_RDI);
            if ((((!bVar1) || (in_ECX == 0x100)) || (*(int *)(in_RDI + 8) == 3)) &&
               (*in_R9 = 1, *(int *)(in_RDI + 8) == 0)) {
              return;
            }
          }
          else if (1 < IVar2 - kInstNop) {
            LogMessage::LogMessage(in_stack_fffffffffffffe30,in_RDI,line);
            poVar5 = LogMessage::stream(&local_1c0);
            in_stack_fffffffffffffe00 = (LogMessage *)std::operator<<(poVar5,"unhandled opcode: ");
            in_stack_fffffffffffffdfc = Prog::Inst::opcode(this_00);
            std::ostream::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
            LogMessage::~LogMessage(in_stack_fffffffffffffe00);
          }
        }
      }
    }
    pDVar3 = (DFA *)((long)&this_01->prog_ + 4);
  } while( true );
}

Assistant:

void DFA::RunWorkqOnByte(Workq* oldq, Workq* newq,
                         int c, uint32_t flag, bool* ismatch) {
  //mutex_.AssertHeld();

  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i)) {
      if (*ismatch)
        return;
      newq->mark();
      continue;
    }
    int id = *i;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstFail:        // never succeeds
      case kInstCapture:     // already followed
      case kInstNop:         // already followed
      case kInstAltMatch:    // already followed
      case kInstEmptyWidth:  // already followed
        break;

      case kInstByteRange:   // can follow if c is in range
        if (ip->Matches(c))
          AddToQueue(newq, ip->out(), flag);
        break;

      case kInstMatch:
        if (prog_->anchor_end() && c != kByteEndText &&
            kind_ != Prog::kManyMatch)
          break;
        *ismatch = true;
        if (kind_ == Prog::kFirstMatch) {
          // Can stop processing work queue since we found a match.
          return;
        }
        break;
    }
  }

  if (ExtraDebug)
    fprintf(stderr, "%s on %d[%#x] -> %s [%d]\n", DumpWorkq(oldq).c_str(),
            c, flag, DumpWorkq(newq).c_str(), *ismatch);
}